

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_table.c
# Opt level: O0

void apx_portConnectorChangeTable_destroy(apx_portConnectorChangeTable_t *self)

{
  uint local_14;
  apx_size_t i;
  apx_portConnectorChangeTable_t *self_local;
  
  if ((self != (apx_portConnectorChangeTable_t *)0x0) &&
     (self->entries != (apx_portConnectorChangeEntry_t *)0x0)) {
    for (local_14 = 0; local_14 < self->num_ports; local_14 = local_14 + 1) {
      apx_portConnectorChangeEntry_destroy(self->entries + local_14);
    }
    free(self->entries);
  }
  return;
}

Assistant:

void apx_portConnectorChangeTable_destroy(apx_portConnectorChangeTable_t *self)
{
   if ( (self != NULL) && (self->entries != 0))
   {
      apx_size_t i;
      for (i=0u; i<self->num_ports; i++)
      {
         apx_portConnectorChangeEntry_destroy(&self->entries[i]);
      }
      free(self->entries);
   }
}